

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O3

cupdlp_dcs * cupdlp_dcs_spalloc(int m,int n,int nzmax,int values,int triplet)

{
  cupdlp_dcs *A;
  int *piVar1;
  int *piVar2;
  double *pdVar3;
  uint uVar4;
  
  A = (cupdlp_dcs *)calloc(1,0x30);
  if (A != (cupdlp_dcs *)0x0) {
    A->m = m;
    A->n = n;
    if (nzmax < 2) {
      nzmax = 1;
    }
    A->nzmax = nzmax;
    uVar4 = n + 1;
    if (triplet != 0) {
      uVar4 = nzmax;
    }
    A->nz = -(uint)(triplet == 0);
    if ((int)uVar4 < 2) {
      uVar4 = 1;
    }
    piVar1 = (int *)malloc((ulong)uVar4 << 2);
    A->p = piVar1;
    piVar2 = (int *)malloc((ulong)(uint)nzmax * 4);
    A->i = piVar2;
    if (values == 0) {
      pdVar3 = (double *)0x0;
    }
    else {
      pdVar3 = (double *)malloc((ulong)(uint)nzmax << 3);
    }
    A->x = pdVar3;
    if (((piVar1 != (int *)0x0) && (piVar2 != (int *)0x0)) &&
       (values == 0 || pdVar3 != (double *)0x0)) {
      return A;
    }
    cupdlp_dcs_spfree(A);
  }
  return (cupdlp_dcs *)0x0;
}

Assistant:

cupdlp_dcs *cupdlp_dcs_spalloc(int m, int n, int nzmax, int values,
                               int triplet) {
  cupdlp_dcs *A = cupdlp_dcs_calloc(
      1, sizeof(cupdlp_dcs)); /* allocate the cupdlp_dcs struct */
  if (!A) return (NULL);      /* out of memory */
  A->m = m;                   /* define dimensions and nzmax */
  A->n = n;
  A->nzmax = nzmax = MAX(nzmax, 1);
  A->nz = triplet ? 0 : -1; /* allocate triplet or comp.col */
  A->p = cupdlp_dcs_malloc(triplet ? nzmax : n + 1, sizeof(int));
  A->i = cupdlp_dcs_malloc(nzmax, sizeof(int));
  A->x = values ? cupdlp_dcs_malloc(nzmax, sizeof(double)) : NULL;
  return ((!A->p || !A->i || (values && !A->x)) ? cupdlp_dcs_spfree(A) : A);
}